

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t COVER_ctx_init(COVER_ctx_t *ctx,void *samplesBuffer,size_t *samplesSizes,uint nbSamples,
                     uint d,double splitPoint)

{
  size_t sVar1;
  ulong *puVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  U32 *pUVar6;
  U32 *pUVar7;
  size_t *psVar8;
  ulong uVar9;
  ulong uVar10;
  code *pcVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  ulong *puVar15;
  U32 UVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  uint *puVar20;
  uint *puVar21;
  ulong uVar22;
  bool bVar23;
  
  uVar4 = 0;
  uVar10 = (ulong)nbSamples;
  if (nbSamples == 0) {
    uVar17 = 0;
  }
  else {
    uVar9 = 0;
    uVar17 = 0;
    do {
      uVar17 = uVar17 + samplesSizes[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  if (splitPoint < 1.0) {
    uVar4 = (uint)(long)((double)uVar10 * splitPoint);
  }
  sVar18 = (long)((double)uVar10 * splitPoint) & 0xffffffff;
  if (1.0 <= splitPoint) {
    sVar18 = (size_t)nbSamples;
  }
  uVar9 = uVar17;
  if (splitPoint < 1.0) {
    if ((uint)sVar18 == 0) {
      uVar9 = 0;
    }
    else {
      sVar12 = 0;
      uVar9 = 0;
      do {
        uVar9 = uVar9 + samplesSizes[sVar12];
        sVar12 = sVar12 + 1;
      } while (sVar18 != sVar12);
    }
  }
  if ((splitPoint < 1.0) && (nbSamples != uVar4)) {
    uVar19 = 0;
    do {
      uVar19 = uVar19 + 1;
    } while (nbSamples - uVar4 != uVar19);
  }
  uVar19 = 8;
  if (8 < d) {
    uVar19 = (ulong)d;
  }
  if (uVar17 < uVar19 || 0xfffffffe < uVar17) {
    sVar18 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      COVER_ctx_init_cold_8();
    }
  }
  else if ((uint)sVar18 < 5) {
    sVar18 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      COVER_ctx_init_cold_7();
    }
  }
  else if (nbSamples == uVar4) {
    sVar18 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      COVER_ctx_init_cold_6();
    }
  }
  else {
    ctx->freqs = (U32 *)0x0;
    ctx->dmerAt = (U32 *)0x0;
    ctx->suffix = (U32 *)0x0;
    ctx->suffixSize = 0;
    ctx->nbTrainSamples = 0;
    ctx->nbTestSamples = 0;
    ctx->samplesSizes = (size_t *)0x0;
    ctx->nbSamples = 0;
    ctx->samples = (BYTE *)0x0;
    ctx->offsets = (size_t *)0x0;
    *(undefined8 *)&ctx->d = 0;
    if (1 < g_displayLevel) {
      COVER_ctx_init_cold_1();
    }
    if (1 < g_displayLevel) {
      COVER_ctx_init_cold_2();
    }
    ctx->samples = (BYTE *)samplesBuffer;
    ctx->samplesSizes = samplesSizes;
    ctx->nbSamples = uVar10;
    ctx->nbTrainSamples = sVar18;
    ctx->nbTestSamples = (ulong)(nbSamples - uVar4);
    ctx->suffixSize = (uVar9 - uVar19) + 1;
    sVar1 = (uVar9 - uVar19) * 4 + 4;
    pUVar6 = (U32 *)malloc(sVar1);
    ctx->suffix = pUVar6;
    pUVar7 = (U32 *)malloc(sVar1);
    ctx->dmerAt = pUVar7;
    uVar4 = nbSamples + 1;
    psVar8 = (size_t *)malloc((ulong)uVar4 * 8);
    ctx->offsets = psVar8;
    if ((pUVar6 == (U32 *)0x0) || (pUVar7 == (U32 *)0x0 || psVar8 == (size_t *)0x0)) {
      if (0 < g_displayLevel) {
        COVER_ctx_init_cold_5();
      }
      COVER_ctx_destroy(ctx);
      sVar18 = 0xffffffffffffffc0;
    }
    else {
      ctx->freqs = (U32 *)0x0;
      ctx->d = d;
      *psVar8 = 0;
      if (nbSamples != 0) {
        uVar10 = 2;
        if (2 < uVar4) {
          uVar10 = (ulong)uVar4;
        }
        sVar18 = *psVar8;
        lVar14 = 0;
        do {
          sVar18 = sVar18 + samplesSizes[lVar14];
          psVar8[lVar14 + 1] = sVar18;
          lVar14 = lVar14 + 1;
        } while (uVar10 - 1 != lVar14);
      }
      if (1 < g_displayLevel) {
        COVER_ctx_init_cold_3();
      }
      sVar1 = ctx->suffixSize;
      if (sVar1 != 0) {
        pUVar6 = ctx->suffix;
        uVar10 = 0;
        do {
          pUVar6[uVar10] = (U32)uVar10;
          uVar10 = uVar10 + 1;
        } while ((uVar10 & 0xffffffff) < sVar1);
      }
      pcVar11 = COVER_strict_cmp;
      if (ctx->d < 9) {
        pcVar11 = COVER_strict_cmp8;
      }
      g_coverCtx = ctx;
      qsort(ctx->suffix,sVar1,4,pcVar11);
      if (1 < g_displayLevel) {
        COVER_ctx_init_cold_4();
      }
      uVar10 = ctx->suffixSize;
      pcVar11 = COVER_cmp;
      if (ctx->d < 9) {
        pcVar11 = COVER_cmp8;
      }
      if (uVar10 != 0) {
        uVar17 = 0;
        puVar20 = ctx->suffix;
        do {
          uVar9 = uVar17 + 1;
          if (uVar17 + 1 < uVar10) {
            uVar9 = uVar10;
          }
          uVar19 = uVar17;
          puVar3 = puVar20;
          do {
            puVar21 = puVar3;
            uVar17 = uVar9;
            if (uVar9 - 1 == uVar19) break;
            uVar17 = uVar19 + 1;
            iVar5 = (*pcVar11)(ctx,puVar20,puVar21 + 1);
            uVar19 = uVar17;
            puVar3 = puVar21 + 1;
          } while (iVar5 == 0);
          pUVar6 = ctx->suffix;
          uVar19 = (ulong)((long)puVar20 - (long)pUVar6) >> 2;
          puVar2 = ctx->offsets;
          sVar18 = ctx->nbSamples;
          uVar9 = *puVar2;
          pUVar7 = ctx->dmerAt;
          UVar16 = 0;
          puVar15 = puVar2;
          do {
            pUVar7[*puVar20] = (U32)uVar19;
            if ((uVar9 <= *puVar20) && (UVar16 = UVar16 + 1, puVar21 != puVar20)) {
              lVar14 = (long)puVar2 + (sVar18 * 8 - (long)puVar15);
              if (lVar14 != 0) {
                uVar9 = lVar14 >> 3;
                do {
                  uVar13 = uVar9 >> 1;
                  uVar22 = ~uVar13 + uVar9;
                  uVar9 = uVar13;
                  if (puVar15[uVar13] < (ulong)*puVar20) {
                    puVar15 = puVar15 + uVar13 + 1;
                    uVar9 = uVar22;
                  }
                } while (uVar9 != 0);
              }
              uVar9 = *puVar15;
              puVar15 = puVar15 + 1;
            }
            bVar23 = puVar21 != puVar20;
            puVar20 = puVar20 + 1;
          } while (bVar23);
          pUVar6[uVar19 & 0xffffffff] = UVar16;
          puVar20 = puVar21 + 1;
        } while (uVar17 < uVar10);
      }
      ctx->freqs = ctx->suffix;
      ctx->suffix = (U32 *)0x0;
      sVar18 = 0;
    }
  }
  return sVar18;
}

Assistant:

static size_t COVER_ctx_init(COVER_ctx_t *ctx, const void *samplesBuffer,
                          const size_t *samplesSizes, unsigned nbSamples,
                          unsigned d, double splitPoint) {
  const BYTE *const samples = (const BYTE *)samplesBuffer;
  const size_t totalSamplesSize = COVER_sum(samplesSizes, nbSamples);
  /* Split samples into testing and training sets */
  const unsigned nbTrainSamples = splitPoint < 1.0 ? (unsigned)((double)nbSamples * splitPoint) : nbSamples;
  const unsigned nbTestSamples = splitPoint < 1.0 ? nbSamples - nbTrainSamples : nbSamples;
  const size_t trainingSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes, nbTrainSamples) : totalSamplesSize;
  const size_t testSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes + nbTrainSamples, nbTestSamples) : totalSamplesSize;
  /* Checks */
  if (totalSamplesSize < MAX(d, sizeof(U64)) ||
      totalSamplesSize >= (size_t)COVER_MAX_SAMPLES_SIZE) {
    DISPLAYLEVEL(1, "Total samples size is too large (%u MB), maximum size is %u MB\n",
                 (unsigned)(totalSamplesSize>>20), (COVER_MAX_SAMPLES_SIZE >> 20));
    return ERROR(srcSize_wrong);
  }
  /* Check if there are at least 5 training samples */
  if (nbTrainSamples < 5) {
    DISPLAYLEVEL(1, "Total number of training samples is %u and is invalid.", nbTrainSamples);
    return ERROR(srcSize_wrong);
  }
  /* Check if there's testing sample */
  if (nbTestSamples < 1) {
    DISPLAYLEVEL(1, "Total number of testing samples is %u and is invalid.", nbTestSamples);
    return ERROR(srcSize_wrong);
  }
  /* Zero the context */
  memset(ctx, 0, sizeof(*ctx));
  DISPLAYLEVEL(2, "Training on %u samples of total size %u\n", nbTrainSamples,
               (unsigned)trainingSamplesSize);
  DISPLAYLEVEL(2, "Testing on %u samples of total size %u\n", nbTestSamples,
               (unsigned)testSamplesSize);
  ctx->samples = samples;
  ctx->samplesSizes = samplesSizes;
  ctx->nbSamples = nbSamples;
  ctx->nbTrainSamples = nbTrainSamples;
  ctx->nbTestSamples = nbTestSamples;
  /* Partial suffix array */
  ctx->suffixSize = trainingSamplesSize - MAX(d, sizeof(U64)) + 1;
  ctx->suffix = (U32 *)malloc(ctx->suffixSize * sizeof(U32));
  /* Maps index to the dmerID */
  ctx->dmerAt = (U32 *)malloc(ctx->suffixSize * sizeof(U32));
  /* The offsets of each file */
  ctx->offsets = (size_t *)malloc((nbSamples + 1) * sizeof(size_t));
  if (!ctx->suffix || !ctx->dmerAt || !ctx->offsets) {
    DISPLAYLEVEL(1, "Failed to allocate scratch buffers\n");
    COVER_ctx_destroy(ctx);
    return ERROR(memory_allocation);
  }
  ctx->freqs = NULL;
  ctx->d = d;

  /* Fill offsets from the samplesSizes */
  {
    U32 i;
    ctx->offsets[0] = 0;
    for (i = 1; i <= nbSamples; ++i) {
      ctx->offsets[i] = ctx->offsets[i - 1] + samplesSizes[i - 1];
    }
  }
  DISPLAYLEVEL(2, "Constructing partial suffix array\n");
  {
    /* suffix is a partial suffix array.
     * It only sorts suffixes by their first parameters.d bytes.
     * The sort is stable, so each dmer group is sorted by position in input.
     */
    U32 i;
    for (i = 0; i < ctx->suffixSize; ++i) {
      ctx->suffix[i] = i;
    }
    /* qsort doesn't take an opaque pointer, so pass as a global.
     * On OpenBSD qsort() is not guaranteed to be stable, their mergesort() is.
     */
    g_coverCtx = ctx;
#if defined(__OpenBSD__)
    mergesort(ctx->suffix, ctx->suffixSize, sizeof(U32),
          (ctx->d <= 8 ? &COVER_strict_cmp8 : &COVER_strict_cmp));
#else
    qsort(ctx->suffix, ctx->suffixSize, sizeof(U32),
          (ctx->d <= 8 ? &COVER_strict_cmp8 : &COVER_strict_cmp));
#endif
  }
  DISPLAYLEVEL(2, "Computing frequencies\n");
  /* For each dmer group (group of positions with the same first d bytes):
   * 1. For each position we set dmerAt[position] = dmerID.  The dmerID is
   *    (groupBeginPtr - suffix).  This allows us to go from position to
   *    dmerID so we can look up values in freq.
   * 2. We calculate how many samples the dmer occurs in and save it in
   *    freqs[dmerId].
   */
  COVER_groupBy(ctx->suffix, ctx->suffixSize, sizeof(U32), ctx,
                (ctx->d <= 8 ? &COVER_cmp8 : &COVER_cmp), &COVER_group);
  ctx->freqs = ctx->suffix;
  ctx->suffix = NULL;
  return 0;
}